

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Array<unsigned_short,(unsigned_short)65535>,unsigned_short>
          (JsonPrinter *this,Array<unsigned_short,_(unsigned_short)65535> *param_2,ushort param_3,
          Type *param_4,int param_5)

{
  return_type val;
  int iVar1;
  ushort local_46;
  unsigned_short i;
  int elem_indent;
  uint8_t *param_6_local;
  int indent_local;
  Type *type_local;
  unsigned_short size_local;
  Array<unsigned_short,_(unsigned_short)65535> *c_local;
  JsonPrinter *this_local;
  
  iVar1 = Indent(this);
  std::__cxx11::string::operator+=((string *)this->text,'[');
  AddNewLine(this);
  for (local_46 = 0; local_46 < param_3; local_46 = local_46 + 1) {
    if (local_46 != 0) {
      AddComma(this);
      AddNewLine(this);
    }
    AddIndent(this,param_5 + iVar1);
    val = Array<unsigned_short,_(unsigned_short)65535>::operator[](param_2,(uint)local_46);
    PrintScalar<unsigned_short>(this,val,param_4,param_5 + iVar1);
  }
  AddNewLine(this);
  AddIndent(this,param_5);
  std::__cxx11::string::operator+=((string *)this->text,']');
  return (char *)0x0;
}

Assistant:

const char *PrintContainer(PrintScalarTag, const Container &c, SizeT size,
                             const Type &type, int indent, const uint8_t *) {
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      PrintScalar(c[i], type, elem_indent);
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }